

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

NodePtr HighsHashTree<int,_HighsImplications::VarBound>::removeChildFromBranchNode
                  (BranchNode *branch,int location,uint64_t hash,int hashPos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  InnerLeaf<1> *leaf;
  void *__dest;
  InnerLeaf<3> *leaf_00;
  InnerLeaf<4> *leaf_01;
  InnerLeaf<2> *leaf_02;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  NodePtr *pNVar6;
  uintptr_t uVar7;
  int i;
  long lVar8;
  
  uVar5 = POPCOUNT((branch->occupation).occupation);
  iVar1 = (int)uVar5;
  if (uVar5 < 10) {
    pNVar6 = branch->child;
    uVar4 = (ulong)(iVar1 + 1);
    iVar3 = 0;
    uVar5 = uVar4;
    do {
      iVar2 = NodePtr::numEntriesEstimate(pNVar6);
      iVar3 = iVar2 + iVar3;
      if (0x36 < iVar3) goto LAB_002adc38;
      pNVar6 = pNVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if (iVar3 != 0x36) {
      pNVar6 = branch->child;
      iVar3 = 0;
      uVar5 = uVar4;
      do {
        iVar2 = NodePtr::numEntries(pNVar6);
        iVar3 = iVar3 + iVar2;
        pNVar6 = pNVar6 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      if (iVar3 < 0x36) {
        switch(iVar3 + 9U >> 4) {
        case 0:
          leaf = (InnerLeaf<1> *)operator_new(0xd8);
          uVar5 = 0;
          (leaf->occupation).occupation = 0;
          leaf->size = 0;
          (leaf->hashes)._M_elems[0] = 0;
          do {
            mergeIntoLeaf<1>(leaf,hashPos,(NodePtr)branch->child[uVar5].ptrAndType);
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
          uVar7 = (ulong)leaf | 2;
          break;
        case 1:
          leaf_02 = (InnerLeaf<2> *)operator_new(0x2d8);
          uVar5 = 0;
          (leaf_02->occupation).occupation = 0;
          leaf_02->size = 0;
          (leaf_02->hashes)._M_elems[0] = 0;
          do {
            mergeIntoLeaf<2>(leaf_02,hashPos,(NodePtr)branch->child[uVar5].ptrAndType);
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
          uVar7 = (ulong)leaf_02 | 3;
          break;
        case 2:
          leaf_00 = (InnerLeaf<3> *)operator_new(0x4d8);
          uVar5 = 0;
          (leaf_00->occupation).occupation = 0;
          leaf_00->size = 0;
          (leaf_00->hashes)._M_elems[0] = 0;
          do {
            mergeIntoLeaf<3>(leaf_00,hashPos,(NodePtr)branch->child[uVar5].ptrAndType);
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
          uVar7 = (ulong)leaf_00 | 4;
          break;
        case 3:
          leaf_01 = (InnerLeaf<4> *)operator_new(0x6d8);
          uVar5 = 0;
          (leaf_01->occupation).occupation = 0;
          leaf_01->size = 0;
          (leaf_01->hashes)._M_elems[0] = 0;
          do {
            mergeIntoLeaf<4>(leaf_01,hashPos,(NodePtr)branch->child[uVar5].ptrAndType);
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
          uVar7 = (ulong)leaf_01 | 5;
          break;
        default:
          uVar7 = 0;
        }
        goto LAB_002adcc4;
      }
    }
  }
LAB_002adc38:
  uVar5 = (ulong)(iVar1 * 8 + 0x47U & 0xffffffc0);
  __n = (long)(iVar1 - location) << 3;
  if (uVar5 == (iVar1 * 8 + 0x4fU & 0xffffffc0)) {
    memmove(branch->child + location,branch[1].child + (long)location + -1,__n);
    return (NodePtr)((ulong)branch | 6);
  }
  __dest = operator_new(uVar5);
  uVar7 = (ulong)__dest | 6;
  lVar8 = (long)location;
  memcpy(__dest,branch,lVar8 * 8 + 8);
  memcpy((void *)(lVar8 * 8 + 8 + (long)__dest),branch[1].child + lVar8 + -1,__n);
LAB_002adcc4:
  operator_delete(branch);
  return (NodePtr)uVar7;
}

Assistant:

static NodePtr removeChildFromBranchNode(BranchNode* branch, int location,
                                           uint64_t hash, int hashPos) {
    NodePtr newNode;
    int newNumChild = branch->occupation.num_set();

    // first check if we might be able to merge all children into one new leaf
    // based on the node numbers and assuming all of them might be in the
    // smallest size class
    if (newNumChild * InnerLeaf<1>::capacity() <= kLeafBurstThreshold) {
      // since we have a good chance of merging we now check the actual size
      // classes to see if that yields a number of entries at most the burst
      // threshold
      int childEntries = 0;
      for (int i = 0; i <= newNumChild; ++i) {
        childEntries += branch->child[i].numEntriesEstimate();
        if (childEntries > kLeafBurstThreshold) break;
      }

      if (childEntries < kLeafBurstThreshold) {
        // create a new merged inner leaf node containing all entries of
        // children first recompute the number of entries, but this time access
        // each child to get the actual number of entries needed and determine
        // this nodes size class since before we estimated the number of child
        // entries from the capacities of our child leaf node types which are
        // stored in the branch nodes pointers directly and avoid unnecessary
        // accesses of nodes that are not in cache.
        childEntries = 0;
        for (int i = 0; i <= newNumChild; ++i)
          childEntries += branch->child[i].numEntries();

        // check again if we exceed due to the extremely unlikely case
        // of having less than 5 list nodes with together more than 30 entries
        // as list nodes are only created in the last depth level
        if (childEntries < kLeafBurstThreshold) {
          switch (entries_to_size_class(childEntries)) {
            case 1: {
              InnerLeaf<1>* newLeafSize1 = new InnerLeaf<1>;
              newNode = newLeafSize1;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize1, hashPos, branch->child[i]);
              break;
            }
            case 2: {
              InnerLeaf<2>* newLeafSize2 = new InnerLeaf<2>;
              newNode = newLeafSize2;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize2, hashPos, branch->child[i]);
              break;
            }
            case 3: {
              InnerLeaf<3>* newLeafSize3 = new InnerLeaf<3>;
              newNode = newLeafSize3;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize3, hashPos, branch->child[i]);
              break;
            }
            case 4: {
              InnerLeaf<4>* newLeafSize4 = new InnerLeaf<4>;
              newNode = newLeafSize4;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize4, hashPos, branch->child[i]);
              break;
            }
            default:
              // Unexpected result from 'entries_to_size_class'
              assert(false);
          }

          destroyBranchingNode(branch);
          return newNode;
        }
      }
    }

    size_t newSize = getBranchNodeSize(newNumChild);
    size_t rightSize = (newNumChild - location) * sizeof(NodePtr);
    if (newSize == getBranchNodeSize(newNumChild + 1)) {
      // allocated size class is the same, so we do not allocate a new node
      memmove(&branch->child[location], &branch->child[location + 1],
              rightSize);
      newNode = branch;
    } else {
      // allocated size class changed, so we allocate a smaller branch node
      BranchNode* compressedBranch = (BranchNode*)::operator new(newSize);
      newNode = compressedBranch;

      size_t leftSize =
          offsetof(BranchNode, child) + location * sizeof(NodePtr);
      memcpy(compressedBranch, branch, leftSize);
      memcpy(&compressedBranch->child[location], &branch->child[location + 1],
             rightSize);

      destroyBranchingNode(branch);
    }

    return newNode;
  }